

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::findDTValidator
          (TraverseSchema *this,DOMElement *elem,XMLCh *derivedTypeName,XMLCh *baseTypeName,
          int baseRefContext)

{
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  uint uVar2;
  XMLCh *pXVar3;
  XMLCh *localPartStr;
  SchemaInfo *this_00;
  DOMElement *childElem;
  DOMElement *baseTypeNode;
  SchemaInfo *impInfo;
  uint uriId;
  uint saveScope;
  SchemaInfo *saveInfo;
  DatatypeValidator *pDStack_58;
  ListType infoType;
  DatatypeValidator *baseValidator;
  XMLCh *uri;
  XMLCh *localPart;
  XMLCh *prefix;
  int baseRefContext_local;
  XMLCh *baseTypeName_local;
  XMLCh *derivedTypeName_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  pXVar3 = getPrefix(this,baseTypeName);
  localPartStr = getLocalPart(this,baseTypeName);
  pXVar3 = resolvePrefixToURI(this,elem,pXVar3);
  pDStack_58 = getDatatypeValidator(this,pXVar3,localPartStr);
  if (pDStack_58 == (DatatypeValidator *)0x0) {
    bVar1 = XMLString::equals(pXVar3,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (bVar1) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar3,localPartStr,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DatatypeValidator *)0x0;
    }
    saveInfo._4_4_ = INCLUDE;
    toRestore = this->fSchemaInfo;
    uVar2 = this->fCurrentScope;
    bVar1 = XMLString::equals(pXVar3,this->fTargetNSURIString);
    if (((!bVar1) && (pXVar3 != (XMLCh *)0x0)) && (*pXVar3 != L'\0')) {
      namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                               (this->fURIStringPool,pXVar3);
      bVar1 = isImportingNS(this,namespaceURI);
      if (!bVar1) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,pXVar3,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        return (DatatypeValidator *)0x0;
      }
      this_00 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
      if ((this_00 == (SchemaInfo *)0x0) || (bVar1 = SchemaInfo::getProcessed(this_00), bVar1)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,pXVar3,localPartStr,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        return (DatatypeValidator *)0x0;
      }
      saveInfo._4_4_ = IMPORT;
      restoreSchemaInfo(this,this_00,IMPORT,0xfffffffe);
    }
    childElem = SchemaInfo::getTopLevelComponent
                          (this->fSchemaInfo,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,localPartStr
                           ,&this->fSchemaInfo);
    if ((childElem != (DOMElement *)0x0) &&
       (pDStack_58 = traverseSimpleTypeDecl(this,childElem,true,0), toRestore != this->fSchemaInfo))
    {
      restoreSchemaInfo(this,toRestore,saveInfo._4_4_,uVar2);
    }
  }
  if (pDStack_58 == (DatatypeValidator *)0x0) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x1e,baseTypeName,derivedTypeName,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    uVar2 = DatatypeValidator::getFinalSet(pDStack_58);
    if ((uVar2 & baseRefContext) != 0) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x3e,baseTypeName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      return (DatatypeValidator *)0x0;
    }
  }
  return pDStack_58;
}

Assistant:

DatatypeValidator*
TraverseSchema::findDTValidator(const DOMElement* const elem,
                                const XMLCh* const derivedTypeName,
                                const XMLCh* const baseTypeName,
                                const int baseRefContext) {

    const XMLCh*       prefix = getPrefix(baseTypeName);
    const XMLCh*       localPart = getLocalPart(baseTypeName);
    const XMLCh*       uri = resolvePrefixToURI(elem, prefix);
    DatatypeValidator* baseValidator = getDatatypeValidator(uri, localPart);

    if (baseValidator == 0) {

        // Check if the base is from the schema for schema namespace
        //
        if (XMLString::equals(uri, SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
            return 0;
        }

        SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
        SchemaInfo* saveInfo = fSchemaInfo;
        unsigned int         saveScope = fCurrentScope;

        if (!XMLString::equals(uri, fTargetNSURIString) && (uri && *uri)) {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uri);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uri);
                return 0;
            }

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }

        DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
            SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

        if (baseTypeNode != 0) {

            baseValidator = traverseSimpleTypeDecl(baseTypeNode);

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }
        }
    }

    if (baseValidator == 0) {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::UnknownBaseDatatype, baseTypeName, derivedTypeName);
    }
    else if ((baseValidator->getFinalSet() & baseRefContext) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DisallowedBaseDerivation, baseTypeName);
        return 0;
    }

    return baseValidator;
}